

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::DatabaseInterface::test_resource_filter
          (DatabaseInterface *this,ResourceTag tag,Hash hash)

{
  bool bVar1;
  uint uVar2;
  size_type sVar3;
  pointer pDVar4;
  byte local_39;
  bool whitelisted;
  Hash HStack_28;
  bool whitelist_sensitive;
  Hash hash_local;
  DatabaseInterface *pDStack_18;
  ResourceTag tag_local;
  DatabaseInterface *this_local;
  
  HStack_28 = hash;
  hash_local._4_4_ = tag;
  pDStack_18 = this;
  if ((this->impl->whitelist_tag_mask & 1 << ((byte)tag & 0x1f)) == 0) goto LAB_001c6746;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this->impl);
  local_39 = 1;
  if (!bVar1) {
    bVar1 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::empty
                      (&this->impl->sub_databases_in_whitelist);
    local_39 = bVar1 ^ 0xff;
  }
  if ((local_39 & 1) == 0) goto LAB_001c6746;
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)this->impl);
  if (bVar1) {
    pDVar4 = std::
             unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ::operator->(&this->impl->whitelist);
    uVar2 = (*pDVar4->_vptr_DatabaseInterface[5])(pDVar4,(ulong)hash_local._4_4_,HStack_28);
    bVar1 = true;
    if ((uVar2 & 1) == 0) goto LAB_001c6705;
  }
  else {
LAB_001c6705:
    sVar3 = std::
            unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
            ::count(this->impl->implicit_whitelisted + hash_local._4_4_,&stack0xffffffffffffffd8);
    bVar1 = sVar3 != 0;
  }
  if (!bVar1) {
    return false;
  }
LAB_001c6746:
  bVar1 = std::unique_ptr::operator_cast_to_bool((unique_ptr *)&this->impl->blacklist);
  if (bVar1) {
    pDVar4 = std::
             unique_ptr<Fossilize::DatabaseInterface,_std::default_delete<Fossilize::DatabaseInterface>_>
             ::operator->(&this->impl->blacklist);
    uVar2 = (*pDVar4->_vptr_DatabaseInterface[5])(pDVar4,(ulong)hash_local._4_4_,HStack_28);
    if ((uVar2 & 1) != 0) {
      return false;
    }
  }
  return true;
}

Assistant:

bool DatabaseInterface::test_resource_filter(ResourceTag tag, Hash hash) const
{
	if ((impl->whitelist_tag_mask & (1u << tag)) != 0)
	{
		bool whitelist_sensitive = impl->whitelist || !impl->sub_databases_in_whitelist.empty();
		if (whitelist_sensitive)
		{
			bool whitelisted = (impl->whitelist && impl->whitelist->has_entry(tag, hash)) ||
			                   (impl->implicit_whitelisted[tag].count(hash) != 0);
			if (!whitelisted)
				return false;
		}
	}

	if (impl->blacklist && impl->blacklist->has_entry(tag, hash))
		return false;

	return true;
}